

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutTests.cpp
# Opt level: O3

void __thiscall
vkt::ssbo::anon_unknown_0::BlockBasicTypeCase::~BlockBasicTypeCase(BlockBasicTypeCase *this)

{
  SSBOLayoutCase::~SSBOLayoutCase(&this->super_SSBOLayoutCase);
  operator_delete(this,0x160);
  return;
}

Assistant:

BlockBasicTypeCase (tcu::TestContext& testCtx, const char* name, const char* description, const VarType& type, deUint32 layoutFlags, int numInstances, MatrixLoadFlags matrixLoadFlag)
		: SSBOLayoutCase(testCtx, name, description, BUFFERMODE_PER_BLOCK, matrixLoadFlag)
	{
		BufferBlock& block = m_interface.allocBlock("Block");
		block.addMember(BufferVar("var", type, ACCESS_READ|ACCESS_WRITE));
		block.setFlags(layoutFlags);

		if (numInstances > 0)
		{
			block.setArraySize(numInstances);
			block.setInstanceName("block");
		}

		init();
	}